

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O1

void * tlp_mwr_data(tlp_mr_hdr *mh)

{
  uint16_t *puVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  
  uVar3 = (ulong)(((mh->tlp).fmt_type & 0x20) >> 5);
  puVar1 = &mh[1].requester + uVar3 * 2;
  uVar2 = (byte)mh->field_0x7 & 0xf;
  if (((mh->field_0x7 & 0xf) != 0) && (uVar2 != 0xf)) {
    lVar4 = 0;
    while ((uVar2 >> ((uint)lVar4 & 0x1f) & 1) == 0) {
      lVar4 = lVar4 + 1;
      if ((int)lVar4 == 4) {
        return &mh[2].tlp + uVar3;
      }
    }
    puVar1 = (uint16_t *)((long)puVar1 + lVar4);
  }
  return puVar1;
}

Assistant:

void *tlp_mwr_data(struct tlp_mr_hdr *mh)
{
	int n;
	void *p;

	p = tlp_is_3dw(mh->tlp.fmt_type) ?
		((char *)(mh + 1)) + 4 : ((char *)(mh + 1)) + 8;

	if (mh->fstdw && mh->fstdw != 0xF) {
		for (n = 0; n < 4; n++) {
			if ((mh->fstdw & (0x1 << n)) == 0) {
				p++;
			} else
				break;
		}
	}

	return p;
}